

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadArray(BCReaderState *s,int tag)

{
  JSValue obj_00;
  JSValue v;
  JSValue val_00;
  JSValue this_obj;
  JSValue v_00;
  JSValue val_01;
  JSValue this_obj_00;
  JSValue JVar1;
  int iVar2;
  uint uVar3;
  int in_ESI;
  int64_t *in_RDI;
  JSValue JVar4;
  int in_stack_00000020;
  BOOL is_template;
  int prop_flags;
  int ret;
  JSValue val;
  uint32_t i;
  uint32_t len;
  JSValue obj;
  JSContext *ctx;
  BCReaderState *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  JSValueUnion in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  uint32_t idx;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  undefined4 uVar7;
  undefined4 uVar8;
  JSAtom prop;
  uint uVar9;
  uint in_stack_ffffffffffffffc4;
  JSValueUnion JVar10;
  int64_t iVar11;
  int in_stack_fffffffffffffff0;
  int32_t iVar12;
  undefined4 uStack_c;
  undefined8 local_8;
  
  iVar11 = *in_RDI;
  JVar4 = JS_NewArray((JSContext *)in_stack_ffffffffffffff70.ptr);
  JVar5 = JVar4.u;
  JVar6 = (JSValueUnion)JVar4.tag;
  JVar4.u._4_4_ = in_stack_ffffffffffffff6c;
  JVar4.u.int32 = in_stack_ffffffffffffff68;
  JVar4.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
  JVar10 = JVar5;
  local_8 = JVar6;
  iVar2 = BC_add_object_ref((BCReaderState *)0x16d402,JVar4);
  if (iVar2 == 0) {
    uVar3 = (uint)(in_ESI == 0xd);
    iVar2 = bc_get_leb128((BCReaderState *)in_stack_ffffffffffffff78.ptr,
                          (uint32_t *)in_stack_ffffffffffffff70.ptr);
    if (iVar2 == 0) {
      for (uVar9 = 0; uVar9 < in_stack_ffffffffffffffc4; uVar9 = uVar9 + 1) {
        JVar4 = JS_ReadObjectRec(in_stack_000000c0);
        in_stack_ffffffffffffff80 = JVar4.u;
        idx = JVar4.tag._4_4_;
        uVar7 = JVar4.u._0_4_;
        uVar8 = JVar4.u._4_4_;
        iVar2 = JS_IsException(JVar4);
        if (iVar2 != 0) goto LAB_0016d5c2;
        if (uVar3 == 0) {
          in_stack_ffffffffffffff68 = 7;
        }
        else {
          in_stack_ffffffffffffff68 = 4;
        }
        this_obj.u._4_4_ = in_stack_ffffffffffffffac;
        this_obj.u.int32 = in_stack_ffffffffffffff68;
        this_obj.tag._0_4_ = uVar7;
        this_obj.tag._4_4_ = uVar8;
        val_00.tag._0_4_ = in_stack_ffffffffffffffa0;
        val_00.u.float64 = JVar6.float64;
        val_00.tag._4_4_ = uVar3;
        in_stack_ffffffffffffffac =
             JS_DefinePropertyValueUint32
                       ((JSContext *)JVar5.ptr,this_obj,idx,val_00,in_stack_00000020);
        if (in_stack_ffffffffffffffac < 0) goto LAB_0016d5c2;
      }
      if (uVar3 != 0) {
        JVar4 = JS_ReadObjectRec(in_stack_000000c0);
        in_stack_ffffffffffffff70 = JVar4.u;
        in_stack_ffffffffffffff78 = (JSValueUnion)JVar4.tag;
        uVar7 = JVar4.u._0_4_;
        prop = JVar4.u._4_4_;
        JVar5 = in_stack_ffffffffffffff78;
        iVar2 = JS_IsException(JVar4);
        if (iVar2 != 0) goto LAB_0016d5c2;
        v_00.u._4_4_ = prop;
        v_00.u.int32 = uVar7;
        v_00.tag = (int64_t)JVar5.ptr;
        iVar2 = JS_IsUndefined(v_00);
        if (iVar2 == 0) {
          in_stack_ffffffffffffff68 = 0;
          this_obj_00.tag = iVar11;
          this_obj_00.u.ptr = local_8;
          val_01.u._4_4_ = in_stack_ffffffffffffffc4;
          val_01.u.int32 = uVar9;
          val_01.tag = (int64_t)JVar10.ptr;
          iVar2 = JS_DefinePropertyValue
                            ((JSContext *)JVar5.ptr,this_obj_00,prop,val_01,
                             in_stack_fffffffffffffff0);
          if (iVar2 < 0) goto LAB_0016d5c2;
        }
        obj_00.tag = (int64_t)in_stack_ffffffffffffff78.ptr;
        obj_00.u.ptr = in_stack_ffffffffffffff70.ptr;
        JS_PreventExtensions
                  ((JSContext *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),obj_00
                  );
      }
      iVar12 = JVar10.int32;
      uStack_c = JVar10._4_4_;
      goto LAB_0016d5ed;
    }
  }
LAB_0016d5c2:
  v.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
  v.u.float64 = in_stack_ffffffffffffff78.float64;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffff70.ptr,v);
  iVar12 = 0;
  local_8 = 2.96439387504748e-323;
LAB_0016d5ed:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = iVar12;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue JS_ReadArray(BCReaderState *s, int tag)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t len, i;
    JSValue val;
    int ret, prop_flags;
    BOOL is_template;

    obj = JS_NewArray(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    is_template = (tag == BC_TAG_TEMPLATE_OBJECT);
    if (bc_get_leb128(s, &len))
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (is_template)
            prop_flags = JS_PROP_ENUMERABLE;
        else
            prop_flags = JS_PROP_C_W_E;
        ret = JS_DefinePropertyValueUint32(ctx, obj, i, val,
                                           prop_flags);
        if (ret < 0)
            goto fail;
    }
    if (is_template) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (!JS_IsUndefined(val)) {
            ret = JS_DefinePropertyValue(ctx, obj, JS_ATOM_raw, val, 0);
            if (ret < 0)
                goto fail;
        }
        JS_PreventExtensions(ctx, obj);
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}